

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<unsigned_char>::add_node
          (CATNMachine<unsigned_char> *this,CharClass<unsigned_char> *cc,int origin,int tag)

{
  pointer pCVar1;
  pointer pCVar2;
  
  pCVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (-1 < origin && pCVar1 != pCVar2) {
    CATNNode<unsigned_char>::add_transition
              (pCVar1 + (uint)origin,cc,(int)(((long)pCVar2 - (long)pCVar1) / 0x50),tag);
  }
  std::
  vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>::
  emplace_back<>(&this->m_nodes);
  return (int)(((long)(this->m_nodes).
                      super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_nodes).
                     super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x50) + -1;
}

Assistant:

int add_node(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(cc, m_nodes.size(), tag);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }